

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
kj::
Maybe<kj::_::Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>_>
::Maybe(Maybe<kj::_::Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>_>
        *this,Tuple<kj::Maybe<kj::Array<kj::String>_>,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>,_kj::Maybe<kj::Array<kj::String>_>_>
              *t)

{
  (this->ptr).isSet = true;
  Maybe<kj::Array<kj::String>_>::Maybe
            ((Maybe<kj::Array<kj::String>_> *)&(this->ptr).field_1.value,
             (Maybe<kj::Array<kj::String>_> *)t);
  *(Orphan<capnp::compiler::Statement> **)((long)&(this->ptr).field_1 + 0x20) =
       (t->impl).super_TupleElement<1U,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>.
       value.ptr;
  *(size_t *)((long)&(this->ptr).field_1 + 0x28) =
       (t->impl).super_TupleElement<1U,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>.
       value.size_;
  *(ArrayDisposer **)((long)&(this->ptr).field_1 + 0x30) =
       (t->impl).super_TupleElement<1U,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>.
       value.disposer;
  (t->impl).super_TupleElement<1U,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>.value.ptr
       = (Orphan<capnp::compiler::Statement> *)0x0;
  (t->impl).super_TupleElement<1U,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>.value.
  size_ = 0;
  Maybe<kj::Array<kj::String>_>::Maybe
            (&(this->ptr).field_1.value.impl.
              super_TupleElement<2U,_kj::Maybe<kj::Array<kj::String>_>_>.value,
             &(t->impl).super_TupleElement<2U,_kj::Maybe<kj::Array<kj::String>_>_>.value);
  return;
}

Assistant:

Maybe(T&& t): ptr(kj::mv(t)) {}